

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O3

void __thiscall QMYSQLResult::cleanup(QMYSQLResult *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  long lVar2;
  void *pvVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  EVP_PKEY_CTX *ctx_00;
  long lVar7;
  
  lVar1 = *(long *)&this->field_0x8;
  lVar6 = *(long *)(lVar1 + 0xb0);
  while( true ) {
    if (lVar6 != 0) {
      mysql_free_result(lVar6);
    }
    lVar6 = QSqlResult::driver();
    if ((((lVar6 == 0) || (*(long *)(lVar1 + 0x10) == 0)) ||
        (*(long *)(*(long *)(*(long *)(lVar1 + 0x18) + 8) + 0xa8) == 0)) ||
       (iVar5 = mysql_next_result(), iVar5 != 0)) break;
    lVar6 = mysql_store_result(*(undefined8 *)(*(long *)(*(long *)(lVar1 + 0x18) + 8) + 0xa8));
  }
  ctx_00 = *(EVP_PKEY_CTX **)(lVar1 + 0xd8);
  if (ctx_00 != (EVP_PKEY_CTX *)0x0) {
    cVar4 = mysql_stmt_close();
    if ((cVar4 != '\0') &&
       (lcMysql(),
       ((byte)lcMysql::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0)) {
      cleanup(ctx_00);
    }
    *(undefined8 *)(lVar1 + 0xd8) = 0;
  }
  if (*(long *)(lVar1 + 0xe0) != 0) {
    mysql_free_result();
    *(undefined8 *)(lVar1 + 0xe0) = 0;
  }
  lVar6 = *(long *)(lVar1 + 0xd0);
  if (lVar6 != 0) {
    lVar2 = *(long *)(lVar1 + 200);
    lVar7 = 0;
    do {
      pvVar3 = *(void **)(lVar2 + lVar7);
      if (pvVar3 != (void *)0x0) {
        operator_delete__(pvVar3);
      }
      lVar7 = lVar7 + 0x28;
    } while (lVar6 * 0x28 != lVar7);
  }
  if (*(void **)(lVar1 + 0xf0) != (void *)0x0) {
    operator_delete__(*(void **)(lVar1 + 0xf0));
    *(undefined8 *)(lVar1 + 0xf0) = 0;
  }
  if (*(void **)(lVar1 + 0xe8) != (void *)0x0) {
    operator_delete__(*(void **)(lVar1 + 0xe8));
    *(undefined8 *)(lVar1 + 0xe8) = 0;
  }
  *(undefined1 *)(lVar1 + 0xfc) = 0;
  QList<QMYSQLResultPrivate::QMyField>::clear
            ((QList<QMYSQLResultPrivate::QMyField> *)(lVar1 + 0xc0));
  *(undefined8 *)(lVar1 + 0xb0) = 0;
  *(undefined8 *)(lVar1 + 0xb8) = 0;
  (**(code **)(*(long *)this + 0x18))(this,0xffffffff);
  (**(code **)(*(long *)this + 0x20))(this,0);
  return;
}

Assistant:

void QMYSQLResult::cleanup()
{
    Q_D(QMYSQLResult);
    if (d->result)
        mysql_free_result(d->result);

// must iterate through leftover result sets from multi-selects or stored procedures
// if this isn't done subsequent queries will fail with "Commands out of sync"
    while (driver() && d->drv_d_func()->mysql && mysql_next_result(d->drv_d_func()->mysql) == 0) {
        MYSQL_RES *res = mysql_store_result(d->drv_d_func()->mysql);
        if (res)
            mysql_free_result(res);
    }

    if (d->stmt) {
        if (mysql_stmt_close(d->stmt))
            qCWarning(lcMysql, "QMYSQLResult::cleanup: unable to free statement handle");
        d->stmt = 0;
    }

    if (d->meta) {
        mysql_free_result(d->meta);
        d->meta = 0;
    }

    for (const QMYSQLResultPrivate::QMyField &f : std::as_const(d->fields))
        delete[] f.outField;

    if (d->outBinds) {
        delete[] d->outBinds;
        d->outBinds = 0;
    }

    if (d->inBinds) {
        delete[] d->inBinds;
        d->inBinds = 0;
    }

    d->hasBlobs = false;
    d->fields.clear();
    d->result = nullptr;
    d->row = nullptr;
    setAt(-1);
    setActive(false);
}